

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

int __thiscall
CVmObjHTTPRequest::getp_parseQuery
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  char *__s;
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  CVmObjLookupTable *tab;
  vm_val_t local_30;
  
  if (getp_parseQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_parseQuery();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_parseQuery::desc);
  if (iVar4 == 0) {
    __s = *(char **)(*(long *)(*(long *)(this->super_CVmObject).ext_ + 0x48) + 0x10);
    sVar6 = strlen(__s);
    vVar5 = CVmObjLookupTable::create(0,0x10,0x20);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar5;
    pvVar3 = sp_;
    uVar2 = *(undefined4 *)&retval->field_0x4;
    aVar1 = retval->val;
    sp_ = sp_ + 1;
    pvVar3->typ = retval->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    tab = (CVmObjLookupTable *)
          ((long)&G_obj_table_X.pages_[(retval->val).obj >> 0xc]->ptr_ +
          (ulong)(((retval->val).obj & 0xfff) * 0x18));
    pcVar7 = strchr(__s,0x3f);
    pcVar8 = __s + sVar6;
    if (pcVar7 != (char *)0x0) {
      pcVar8 = pcVar7;
    }
    local_30.typ = VM_INT;
    local_30.val.obj = 1;
    add_parsed_val(tab,&local_30,__s,(long)pcVar8 - (long)__s,1);
    if (*pcVar8 == '?') {
      parse_query_params(tab,pcVar8 + 1,1);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_parseQuery(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the query string from the request */
    TadsHttpRequest *req = get_ext()->req;
    const char *q = req->resource_name->get();
    size_t ql = strlen(q);

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 16, 32));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   the resource name is the part of the query up to the first '?', or
     *   the entire string if there's no '?' 
     */
    const char *qq = strchr(q, '?');
    if (qq == 0)
        qq = q + ql;

    /* add the resource name under key [1] */
    add_parsed_val(vmg_ tab, 1, q, qq - q, ENCMODE_URL);

    /* parse the query parameters, starting after the '?' */
    if (*qq == '?')
        parse_query_params(vmg_ tab, qq + 1, ENCMODE_URL);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}